

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeopardFF16.cpp
# Opt level: O0

void leopard::ff16::FFT_DIT2(void *x,void *y,ffe_t log_m,uint64_t bytes)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  ushort uVar48;
  undefined1 (*pauVar49) [32];
  undefined1 (*pauVar50) [16];
  undefined1 (*pauVar51) [16];
  long lVar52;
  long in_RCX;
  ushort in_DX;
  undefined1 (*in_RSI) [32];
  ulong *in_RDI;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  __m128i data_0_2;
  __m128i data_1_2;
  __m128i prod_hi_2;
  __m128i prod_lo_2;
  __m128i y_hi_2;
  __m128i y_lo_2;
  __m128i x_hi_2;
  __m128i x_lo_2;
  __m128i data_0_1;
  __m128i data_1_1;
  __m128i prod_hi_1;
  __m128i prod_lo_1;
  __m128i y_hi_1;
  __m128i y_lo_1;
  __m128i x_hi_1;
  __m128i x_lo_1;
  __m128i *y16;
  __m128i *x16;
  __m128i clr_mask_1;
  __m128i T3_hi_0_1;
  __m128i T2_hi_0_1;
  __m128i T1_hi_0_1;
  __m128i T0_hi_0_1;
  __m128i T3_lo_0_1;
  __m128i T2_lo_0_1;
  __m128i T1_lo_0_1;
  __m128i T0_lo_0_1;
  __m256i data_0;
  __m256i data_1;
  __m256i prod_hi;
  __m256i prod_lo;
  __m256i y_hi;
  __m256i y_lo;
  __m256i x_hi;
  __m256i x_lo;
  __m256i *y32;
  __m256i *x32;
  __m256i clr_mask;
  __m256i T3_hi_0;
  __m256i T2_hi_0;
  __m256i T1_hi_0;
  __m256i T0_hi_0;
  __m256i T3_lo_0;
  __m256i T2_lo_0;
  __m256i T1_lo_0;
  __m256i T0_lo_0;
  ffe_t prod;
  uint hi;
  uint lo;
  uint i;
  uint8_t *x1;
  uint8_t *y1;
  ffe_t *lut;
  ulong local_13c0;
  ulong uStackY_13b8;
  ulong local_13b0;
  ulong uStackY_13a8;
  ulong local_1340;
  ulong uStackY_1338;
  ulong local_1330;
  ulong uStackY_1328;
  undefined1 (*local_12e0) [32];
  ulong *local_12d8;
  uint64_t in_stack_ffffffffffffed40;
  void *in_stack_ffffffffffffed48;
  void *in_stack_ffffffffffffed50;
  ulong local_1200;
  ulong uStack_11f8;
  ulong uStack_11f0;
  ulong uStack_11e8;
  ulong local_11e0;
  ulong uStack_11d8;
  ulong uStack_11d0;
  ulong uStack_11c8;
  undefined1 (*local_1130) [32];
  ulong *local_1128;
  long local_fe8;
  ulong local_e60;
  ulong uStack_e58;
  ulong uStack_e50;
  ulong uStack_e48;
  ulong local_e20;
  ulong uStack_e18;
  ulong uStack_e10;
  ulong uStack_e08;
  ulong local_de0;
  ulong uStack_dd8;
  ulong uStack_dd0;
  ulong uStack_dc8;
  ulong local_da0;
  ulong uStack_d98;
  ulong uStack_d90;
  ulong uStack_d88;
  ulong local_d60;
  ulong uStack_d58;
  ulong uStack_d50;
  ulong uStack_d48;
  ulong local_d20;
  ulong uStack_d18;
  ulong uStack_d10;
  ulong uStack_d08;
  ulong local_760;
  ulong uStack_758;
  ulong local_740;
  ulong uStack_738;
  ulong local_720;
  ulong uStack_718;
  ulong local_700;
  ulong uStack_6f8;
  ulong local_6e0;
  ulong uStack_6d8;
  ulong local_6c0;
  ulong uStack_6b8;
  ulong local_620;
  ulong uStack_618;
  ulong local_600;
  ulong uStack_5f8;
  ulong local_5e0;
  ulong uStack_5d8;
  ulong local_5c0;
  ulong uStack_5b8;
  ulong local_5a0;
  ulong uStack_598;
  ulong local_580;
  ulong uStack_578;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  uint local_6c;
  ulong *local_68;
  undefined1 (*local_60) [32];
  long local_50;
  
  local_fe8 = in_RCX;
  if ((CpuHasAVX2 & 1) == 0) {
    if ((CpuHasSSSE3 & 1) == 0) {
      lVar52 = Multiply16LUT + (ulong)in_DX * 0x80;
      local_68 = in_RDI;
      local_60 = in_RSI;
      local_50 = in_RCX;
      do {
        for (local_6c = 0; local_6c < 0x20; local_6c = local_6c + 1) {
          uVar48 = *(ushort *)(lVar52 + (ulong)((byte)(*local_60)[local_6c] & 0xf) * 2) ^
                   *(ushort *)(lVar52 + (ulong)(((byte)(*local_60)[local_6c] >> 4) + 0x10) * 2) ^
                   *(ushort *)
                    (lVar52 + (ulong)(((byte)(*local_60)[local_6c + 0x20] & 0xf) + 0x20) * 2) ^
                   *(ushort *)
                    (lVar52 + (ulong)(((byte)(*local_60)[local_6c + 0x20] >> 4) + 0x30) * 2);
          *(byte *)((long)local_68 + (ulong)local_6c) =
               *(byte *)((long)local_68 + (ulong)local_6c) ^ (byte)uVar48;
          *(byte *)((long)local_68 + (ulong)(local_6c + 0x20)) =
               *(byte *)((long)local_68 + (ulong)(local_6c + 0x20)) ^ (byte)(uVar48 >> 8);
        }
        local_68 = local_68 + 8;
        local_60 = local_60 + 2;
        local_50 = local_50 + -0x40;
      } while (local_50 != 0);
      xor_mem(in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,in_stack_ffffffffffffed40);
    }
    else {
      pauVar50 = (undefined1 (*) [16])(Multiply128LUT + (ulong)in_DX * 0x80);
      auVar40 = *pauVar50;
      auVar53 = *pauVar50;
      pauVar50 = (undefined1 (*) [16])(Multiply128LUT + 0x10 + (ulong)in_DX * 0x80);
      auVar42 = *pauVar50;
      auVar34 = *pauVar50;
      pauVar50 = (undefined1 (*) [16])(Multiply128LUT + 0x20 + (ulong)in_DX * 0x80);
      auVar44 = *pauVar50;
      auVar36 = *pauVar50;
      pauVar50 = (undefined1 (*) [16])(Multiply128LUT + 0x30 + (ulong)in_DX * 0x80);
      auVar46 = *pauVar50;
      auVar38 = *pauVar50;
      pauVar50 = (undefined1 (*) [16])(Multiply128LUT + 0x40 + (ulong)in_DX * 0x80);
      auVar41 = *pauVar50;
      auVar33 = *pauVar50;
      pauVar50 = (undefined1 (*) [16])(Multiply128LUT + 0x50 + (ulong)in_DX * 0x80);
      auVar43 = *pauVar50;
      auVar35 = *pauVar50;
      pauVar50 = (undefined1 (*) [16])(Multiply128LUT + 0x60 + (ulong)in_DX * 0x80);
      auVar45 = *pauVar50;
      auVar37 = *pauVar50;
      pauVar50 = (undefined1 (*) [16])(Multiply128LUT + 0x70 + (ulong)in_DX * 0x80);
      auVar47 = *pauVar50;
      auVar39 = *pauVar50;
      auVar54 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
      auVar54 = vpinsrb_avx(auVar54,0xf,2);
      auVar54 = vpinsrb_avx(auVar54,0xf,3);
      auVar54 = vpinsrb_avx(auVar54,0xf,4);
      auVar54 = vpinsrb_avx(auVar54,0xf,5);
      auVar54 = vpinsrb_avx(auVar54,0xf,6);
      auVar54 = vpinsrb_avx(auVar54,0xf,7);
      auVar54 = vpinsrb_avx(auVar54,0xf,8);
      auVar54 = vpinsrb_avx(auVar54,0xf,9);
      auVar54 = vpinsrb_avx(auVar54,0xf,10);
      auVar54 = vpinsrb_avx(auVar54,0xf,0xb);
      auVar54 = vpinsrb_avx(auVar54,0xf,0xc);
      auVar54 = vpinsrb_avx(auVar54,0xf,0xd);
      auVar54 = vpinsrb_avx(auVar54,0xf,0xe);
      auVar54 = vpinsrb_avx(auVar54,0xf,0xf);
      local_12e0 = in_RSI;
      local_12d8 = in_RDI;
      do {
        pauVar50 = (undefined1 (*) [16])(*local_12e0 + 0x10);
        uVar7 = *(ulong *)*pauVar50;
        uVar8 = *(ulong *)(*local_12e0 + 0x18);
        pauVar51 = (undefined1 (*) [16])(local_12e0[1] + 0x10);
        uVar9 = *(ulong *)*pauVar51;
        uVar10 = *(ulong *)(local_12e0[1] + 0x18);
        auVar3 = vpsrlq_avx(*pauVar50,ZEXT416(4));
        auVar1 = vpand_avx(*pauVar50,auVar54);
        auVar3 = vpand_avx(auVar3,auVar54);
        auVar2 = vpshufb_avx(auVar53,auVar1);
        auVar1 = vpshufb_avx(auVar33,auVar1);
        local_1330 = auVar2._0_8_;
        uStackY_1328 = auVar2._8_8_;
        auVar2 = vpshufb_avx(auVar34,auVar3);
        local_580 = auVar2._0_8_;
        uStack_578 = auVar2._8_8_;
        local_1340 = auVar1._0_8_;
        uStackY_1338 = auVar1._8_8_;
        auVar1 = vpshufb_avx(auVar35,auVar3);
        local_5a0 = auVar1._0_8_;
        uStack_598 = auVar1._8_8_;
        auVar1 = vpand_avx(*pauVar51,auVar54);
        auVar3 = vpsrlq_avx(*pauVar51,ZEXT416(4));
        auVar3 = vpand_avx(auVar3,auVar54);
        auVar2 = vpshufb_avx(auVar36,auVar1);
        local_5c0 = auVar2._0_8_;
        uStack_5b8 = auVar2._8_8_;
        auVar1 = vpshufb_avx(auVar37,auVar1);
        local_5e0 = auVar1._0_8_;
        uStack_5d8 = auVar1._8_8_;
        auVar1 = vpshufb_avx(auVar38,auVar3);
        local_600 = auVar1._0_8_;
        uStack_5f8 = auVar1._8_8_;
        auVar1 = vpshufb_avx(auVar39,auVar3);
        local_620 = auVar1._0_8_;
        uStack_618 = auVar1._8_8_;
        uVar11 = local_12d8[2] ^ local_1330 ^ local_580 ^ local_5c0 ^ local_600;
        uVar12 = local_12d8[3] ^ uStackY_1328 ^ uStack_578 ^ uStack_5b8 ^ uStack_5f8;
        uVar13 = local_12d8[6] ^ local_1340 ^ local_5a0 ^ local_5e0 ^ local_620;
        uVar14 = local_12d8[7] ^ uStackY_1338 ^ uStack_598 ^ uStack_5d8 ^ uStack_618;
        local_12d8[2] = uVar11;
        local_12d8[3] = uVar12;
        local_12d8[6] = uVar13;
        local_12d8[7] = uVar14;
        *(ulong *)(*local_12e0 + 0x10) = uVar7 ^ uVar11;
        *(ulong *)(*local_12e0 + 0x18) = uVar8 ^ uVar12;
        *(ulong *)(local_12e0[1] + 0x10) = uVar9 ^ uVar13;
        *(ulong *)(local_12e0[1] + 0x18) = uVar10 ^ uVar14;
        uVar7 = *(ulong *)*local_12e0;
        uVar8 = *(ulong *)(*local_12e0 + 8);
        pauVar49 = local_12e0 + 1;
        uVar9 = *(ulong *)*pauVar49;
        uVar10 = *(ulong *)(local_12e0[1] + 8);
        auVar3 = vpsrlq_avx(*(undefined1 (*) [16])*local_12e0,ZEXT416(4));
        auVar1 = vpand_avx(*(undefined1 (*) [16])*local_12e0,auVar54);
        auVar3 = vpand_avx(auVar3,auVar54);
        auVar2 = vpshufb_avx(auVar40,auVar1);
        auVar1 = vpshufb_avx(auVar41,auVar1);
        local_13b0 = auVar2._0_8_;
        uStackY_13a8 = auVar2._8_8_;
        auVar2 = vpshufb_avx(auVar42,auVar3);
        local_6c0 = auVar2._0_8_;
        uStack_6b8 = auVar2._8_8_;
        local_13c0 = auVar1._0_8_;
        uStackY_13b8 = auVar1._8_8_;
        auVar1 = vpshufb_avx(auVar43,auVar3);
        local_6e0 = auVar1._0_8_;
        uStack_6d8 = auVar1._8_8_;
        auVar1 = vpand_avx(*(undefined1 (*) [16])*pauVar49,auVar54);
        auVar3 = vpsrlq_avx(*(undefined1 (*) [16])*pauVar49,ZEXT416(4));
        auVar3 = vpand_avx(auVar3,auVar54);
        auVar2 = vpshufb_avx(auVar44,auVar1);
        local_700 = auVar2._0_8_;
        uStack_6f8 = auVar2._8_8_;
        auVar1 = vpshufb_avx(auVar45,auVar1);
        local_720 = auVar1._0_8_;
        uStack_718 = auVar1._8_8_;
        auVar1 = vpshufb_avx(auVar46,auVar3);
        local_740 = auVar1._0_8_;
        uStack_738 = auVar1._8_8_;
        auVar1 = vpshufb_avx(auVar47,auVar3);
        local_760 = auVar1._0_8_;
        uStack_758 = auVar1._8_8_;
        uVar11 = *local_12d8 ^ local_13b0 ^ local_6c0 ^ local_700 ^ local_740;
        uVar12 = local_12d8[1] ^ uStackY_13a8 ^ uStack_6b8 ^ uStack_6f8 ^ uStack_738;
        uVar13 = local_12d8[4] ^ local_13c0 ^ local_6e0 ^ local_720 ^ local_760;
        uVar14 = local_12d8[5] ^ uStackY_13b8 ^ uStack_6d8 ^ uStack_718 ^ uStack_758;
        *local_12d8 = uVar11;
        local_12d8[1] = uVar12;
        local_12d8[4] = uVar13;
        local_12d8[5] = uVar14;
        *(ulong *)*local_12e0 = uVar7 ^ uVar11;
        *(ulong *)(*local_12e0 + 8) = uVar8 ^ uVar12;
        *(ulong *)local_12e0[1] = uVar9 ^ uVar13;
        *(ulong *)(local_12e0[1] + 8) = uVar10 ^ uVar14;
        local_12d8 = local_12d8 + 8;
        local_12e0 = local_12e0 + 2;
        local_fe8 = local_fe8 + -0x40;
      } while (local_fe8 != 0);
    }
  }
  else {
    auVar25 = *(undefined1 (*) [32])(Multiply256LUT + (ulong)in_DX * 0x100);
    auVar27 = *(undefined1 (*) [32])(Multiply256LUT + 0x20 + (ulong)in_DX * 0x100);
    auVar29 = *(undefined1 (*) [32])(Multiply256LUT + 0x40 + (ulong)in_DX * 0x100);
    auVar31 = *(undefined1 (*) [32])(Multiply256LUT + 0x60 + (ulong)in_DX * 0x100);
    auVar26 = *(undefined1 (*) [32])(Multiply256LUT + 0x80 + (ulong)in_DX * 0x100);
    auVar28 = *(undefined1 (*) [32])(Multiply256LUT + 0xa0 + (ulong)in_DX * 0x100);
    auVar30 = *(undefined1 (*) [32])(Multiply256LUT + 0xc0 + (ulong)in_DX * 0x100);
    auVar32 = *(undefined1 (*) [32])(Multiply256LUT + 0xe0 + (ulong)in_DX * 0x100);
    auVar54 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
    auVar54 = vpinsrb_avx(auVar54,0xf,2);
    auVar54 = vpinsrb_avx(auVar54,0xf,3);
    auVar54 = vpinsrb_avx(auVar54,0xf,4);
    auVar54 = vpinsrb_avx(auVar54,0xf,5);
    auVar54 = vpinsrb_avx(auVar54,0xf,6);
    auVar54 = vpinsrb_avx(auVar54,0xf,7);
    auVar54 = vpinsrb_avx(auVar54,0xf,8);
    auVar54 = vpinsrb_avx(auVar54,0xf,9);
    auVar54 = vpinsrb_avx(auVar54,0xf,10);
    auVar54 = vpinsrb_avx(auVar54,0xf,0xb);
    auVar54 = vpinsrb_avx(auVar54,0xf,0xc);
    auVar54 = vpinsrb_avx(auVar54,0xf,0xd);
    auVar54 = vpinsrb_avx(auVar54,0xf,0xe);
    auVar54 = vpinsrb_avx(auVar54,0xf,0xf);
    auVar53 = vpinsrb_avx(ZEXT116(0xf),0xf,1);
    auVar53 = vpinsrb_avx(auVar53,0xf,2);
    auVar53 = vpinsrb_avx(auVar53,0xf,3);
    auVar53 = vpinsrb_avx(auVar53,0xf,4);
    auVar53 = vpinsrb_avx(auVar53,0xf,5);
    auVar53 = vpinsrb_avx(auVar53,0xf,6);
    auVar53 = vpinsrb_avx(auVar53,0xf,7);
    auVar53 = vpinsrb_avx(auVar53,0xf,8);
    auVar53 = vpinsrb_avx(auVar53,0xf,9);
    auVar53 = vpinsrb_avx(auVar53,0xf,10);
    auVar53 = vpinsrb_avx(auVar53,0xf,0xb);
    auVar53 = vpinsrb_avx(auVar53,0xf,0xc);
    auVar53 = vpinsrb_avx(auVar53,0xf,0xd);
    auVar53 = vpinsrb_avx(auVar53,0xf,0xe);
    auVar53 = vpinsrb_avx(auVar53,0xf,0xf);
    auVar53 = ZEXT116(0) * auVar54 + ZEXT116(1) * auVar53;
    auVar54 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar54;
    uStack_d0 = auVar54._0_8_;
    uStack_c8 = auVar54._8_8_;
    local_1130 = in_RSI;
    local_1128 = in_RDI;
    do {
      uVar7 = *(ulong *)*local_1130;
      uVar8 = *(ulong *)(*local_1130 + 8);
      uVar9 = *(ulong *)(*local_1130 + 0x10);
      uVar10 = *(ulong *)(*local_1130 + 0x18);
      pauVar49 = local_1130 + 1;
      uVar11 = *(ulong *)*pauVar49;
      uVar12 = *(ulong *)(local_1130[1] + 8);
      uVar13 = *(ulong *)(local_1130[1] + 0x10);
      uVar14 = *(ulong *)(local_1130[1] + 0x18);
      auVar6 = vpsrlq_avx2(*local_1130,ZEXT416(4));
      auVar24._16_8_ = uStack_d0;
      auVar24._0_16_ = auVar53;
      auVar24._24_8_ = uStack_c8;
      auVar4 = vpand_avx2(*local_1130,auVar24);
      auVar23._16_8_ = uStack_d0;
      auVar23._0_16_ = auVar53;
      auVar23._24_8_ = uStack_c8;
      auVar6 = vpand_avx2(auVar6,auVar23);
      auVar5 = vpshufb_avx2(auVar25,auVar4);
      auVar4 = vpshufb_avx2(auVar26,auVar4);
      local_11e0 = auVar5._0_8_;
      uStack_11d8 = auVar5._8_8_;
      uStack_11d0 = auVar5._16_8_;
      uStack_11c8 = auVar5._24_8_;
      auVar5 = vpshufb_avx2(auVar27,auVar6);
      local_d20 = auVar5._0_8_;
      uStack_d18 = auVar5._8_8_;
      uStack_d10 = auVar5._16_8_;
      uStack_d08 = auVar5._24_8_;
      local_1200 = auVar4._0_8_;
      uStack_11f8 = auVar4._8_8_;
      uStack_11f0 = auVar4._16_8_;
      uStack_11e8 = auVar4._24_8_;
      auVar4 = vpshufb_avx2(auVar28,auVar6);
      local_d60 = auVar4._0_8_;
      uStack_d58 = auVar4._8_8_;
      uStack_d50 = auVar4._16_8_;
      uStack_d48 = auVar4._24_8_;
      auVar4._16_8_ = uStack_d0;
      auVar4._0_16_ = auVar53;
      auVar4._24_8_ = uStack_c8;
      auVar4 = vpand_avx2(*pauVar49,auVar4);
      auVar6 = vpsrlq_avx2(*pauVar49,ZEXT416(4));
      auVar5._16_8_ = uStack_d0;
      auVar5._0_16_ = auVar53;
      auVar5._24_8_ = uStack_c8;
      auVar6 = vpand_avx2(auVar6,auVar5);
      auVar5 = vpshufb_avx2(auVar29,auVar4);
      local_da0 = auVar5._0_8_;
      uStack_d98 = auVar5._8_8_;
      uStack_d90 = auVar5._16_8_;
      uStack_d88 = auVar5._24_8_;
      auVar4 = vpshufb_avx2(auVar30,auVar4);
      local_de0 = auVar4._0_8_;
      uStack_dd8 = auVar4._8_8_;
      uStack_dd0 = auVar4._16_8_;
      uStack_dc8 = auVar4._24_8_;
      auVar4 = vpshufb_avx2(auVar31,auVar6);
      local_e20 = auVar4._0_8_;
      uStack_e18 = auVar4._8_8_;
      uStack_e10 = auVar4._16_8_;
      uStack_e08 = auVar4._24_8_;
      auVar4 = vpshufb_avx2(auVar32,auVar6);
      local_e60 = auVar4._0_8_;
      uStack_e58 = auVar4._8_8_;
      uStack_e50 = auVar4._16_8_;
      uStack_e48 = auVar4._24_8_;
      uVar15 = *local_1128 ^ local_11e0 ^ local_d20 ^ local_da0 ^ local_e20;
      uVar16 = local_1128[1] ^ uStack_11d8 ^ uStack_d18 ^ uStack_d98 ^ uStack_e18;
      uVar17 = local_1128[2] ^ uStack_11d0 ^ uStack_d10 ^ uStack_d90 ^ uStack_e10;
      uVar18 = local_1128[3] ^ uStack_11c8 ^ uStack_d08 ^ uStack_d88 ^ uStack_e08;
      uVar19 = local_1128[4] ^ local_1200 ^ local_d60 ^ local_de0 ^ local_e60;
      uVar20 = local_1128[5] ^ uStack_11f8 ^ uStack_d58 ^ uStack_dd8 ^ uStack_e58;
      uVar21 = local_1128[6] ^ uStack_11f0 ^ uStack_d50 ^ uStack_dd0 ^ uStack_e50;
      uVar22 = local_1128[7] ^ uStack_11e8 ^ uStack_d48 ^ uStack_dc8 ^ uStack_e48;
      *local_1128 = uVar15;
      local_1128[1] = uVar16;
      local_1128[2] = uVar17;
      local_1128[3] = uVar18;
      local_1128[4] = uVar19;
      local_1128[5] = uVar20;
      local_1128[6] = uVar21;
      local_1128[7] = uVar22;
      *(ulong *)*local_1130 = uVar7 ^ uVar15;
      *(ulong *)(*local_1130 + 8) = uVar8 ^ uVar16;
      *(ulong *)(*local_1130 + 0x10) = uVar9 ^ uVar17;
      *(ulong *)(*local_1130 + 0x18) = uVar10 ^ uVar18;
      *(ulong *)local_1130[1] = uVar11 ^ uVar19;
      *(ulong *)(local_1130[1] + 8) = uVar12 ^ uVar20;
      *(ulong *)(local_1130[1] + 0x10) = uVar13 ^ uVar21;
      *(ulong *)(local_1130[1] + 0x18) = uVar14 ^ uVar22;
      local_1130 = local_1130 + 2;
      local_1128 = local_1128 + 8;
      local_fe8 = local_fe8 + -0x40;
    } while (local_fe8 != 0);
  }
  return;
}

Assistant:

static void FFT_DIT2(
    void * LEO_RESTRICT x, void * LEO_RESTRICT y,
    ffe_t log_m, uint64_t bytes)
{
#if defined(LEO_TRY_AVX2)
    if (CpuHasAVX2)
    {
        LEO_MUL_TABLES_256(0, log_m);

        const LEO_M256 clr_mask = _mm256_set1_epi8(0x0f);

        LEO_M256 * LEO_RESTRICT x32 = reinterpret_cast<LEO_M256 *>(x);
        LEO_M256 * LEO_RESTRICT y32 = reinterpret_cast<LEO_M256 *>(y);

        do
        {
#define LEO_FFTB_256(x_ptr, y_ptr) { \
            LEO_M256 x_lo = _mm256_loadu_si256(x_ptr); \
            LEO_M256 x_hi = _mm256_loadu_si256(x_ptr + 1); \
            LEO_M256 y_lo = _mm256_loadu_si256(y_ptr); \
            LEO_M256 y_hi = _mm256_loadu_si256(y_ptr + 1); \
            LEO_MULADD_256(x_lo, x_hi, y_lo, y_hi, 0); \
            _mm256_storeu_si256(x_ptr, x_lo); \
            _mm256_storeu_si256(x_ptr + 1, x_hi); \
            y_lo = _mm256_xor_si256(y_lo, x_lo); \
            y_hi = _mm256_xor_si256(y_hi, x_hi); \
            _mm256_storeu_si256(y_ptr, y_lo); \
            _mm256_storeu_si256(y_ptr + 1, y_hi); }

            LEO_FFTB_256(x32, y32);
            y32 += 2, x32 += 2;

            bytes -= 64;
        } while (bytes > 0);

        return;
    }
#endif // LEO_TRY_AVX2

    if (CpuHasSSSE3)
    {
        LEO_MUL_TABLES_128(0, log_m);

        const LEO_M128 clr_mask = _mm_set1_epi8(0x0f);

        LEO_M128 * LEO_RESTRICT x16 = reinterpret_cast<LEO_M128 *>(x);
        LEO_M128 * LEO_RESTRICT y16 = reinterpret_cast<LEO_M128 *>(y);

        do
        {
#define LEO_FFTB_128(x_ptr, y_ptr) { \
                LEO_M128 x_lo = _mm_loadu_si128(x_ptr); \
                LEO_M128 x_hi = _mm_loadu_si128(x_ptr + 2); \
                LEO_M128 y_lo = _mm_loadu_si128(y_ptr); \
                LEO_M128 y_hi = _mm_loadu_si128(y_ptr + 2); \
                LEO_MULADD_128(x_lo, x_hi, y_lo, y_hi, 0); \
                _mm_storeu_si128(x_ptr, x_lo); \
                _mm_storeu_si128(x_ptr + 2, x_hi); \
                y_lo = _mm_xor_si128(y_lo, x_lo); \
                y_hi = _mm_xor_si128(y_hi, x_hi); \
                _mm_storeu_si128(y_ptr, y_lo); \
                _mm_storeu_si128(y_ptr + 2, y_hi); }

            LEO_FFTB_128(x16 + 1, y16 + 1);
            LEO_FFTB_128(x16, y16);
            x16 += 4, y16 += 4;

            bytes -= 64;
        } while (bytes > 0);

        return;
    }

    // Reference version:
    RefMulAdd(x, y, log_m, bytes);
    xor_mem(y, x, bytes);
}